

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void burstsort2_sampling_superalphabet_vector(uchar **strings,size_t n)

{
  uchar *puVar1;
  ulong uVar2;
  iterator __position;
  bool bVar3;
  ushort uVar4;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar5;
  undefined8 *puVar6;
  pointer ppvVar7;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *this;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar8;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  _func_void_uchar_ptr_ptr_int_int *p_Var12;
  uint uVar13;
  size_t depth;
  long lVar15;
  uchar *str;
  BurstSimple<unsigned_short> local_51;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
  *local_50;
  size_t local_48;
  uchar **local_40;
  uchar *local_38;
  ulong uVar14;
  
  local_40 = strings;
  pTVar5 = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
            *)operator_new(0x18);
  (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = n;
  if (n != 0) {
    lVar11 = 2000;
    uVar9 = 0;
    local_50 = pTVar5;
    do {
      puVar1 = local_40[uVar9];
      if (puVar1 == (uchar *)0x0) goto LAB_001a1f65;
      lVar15 = 0;
      pTVar5 = local_50;
      do {
        if (puVar1[lVar15] == '\0') {
          uVar4 = 0;
        }
        else {
          uVar4 = CONCAT11(puVar1[lVar15],puVar1[lVar15 + 1]);
        }
        if ((char)uVar4 == '\0') {
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x6;
          bVar3 = false;
        }
        else {
          uVar13 = (uint)uVar4;
          uVar14 = (ulong)uVar13;
          if ((ulong)((long)(pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(uVar13 + 1)) {
            std::vector<void_*,_std::allocator<void_*>_>::resize
                      (&pTVar5->_buckets,(ulong)(uVar13 + 1));
          }
          lVar15 = lVar15 + 2;
          ppvVar7 = (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar7 >> 3) <=
               uVar14) || (((ulong)ppvVar7[uVar14] & 1) == 0)) {
            puVar6 = (undefined8 *)operator_new(0x18);
            *puVar6 = 0;
            puVar6[1] = 0;
            puVar6[2] = 0;
            *(undefined8 **)
             ((long)(pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)(uVar13 * 8)) = puVar6;
            ppvVar7 = (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
            uVar2 = *(ulong *)((long)ppvVar7 + (ulong)(uVar13 * 8));
            if (uVar2 == 0) goto LAB_001a1f27;
            ppvVar7[uVar14] = (void *)(uVar2 | 1);
            lVar11 = lVar11 + -1;
            if (lVar11 == 0) {
              bVar3 = false;
              in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x7;
              lVar11 = 0;
              goto LAB_001a1d5e;
            }
          }
          pTVar5 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                   ::get_node(pTVar5,uVar13);
          if (pTVar5 == (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                         *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xd9,
                          "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                         );
          }
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x0;
          bVar3 = true;
        }
LAB_001a1d5e:
      } while ((int)in_RCX == 0);
      if ((int)in_RCX == 6) {
        bVar3 = true;
      }
      uVar9 = uVar9 + 0x2000;
    } while ((uVar9 < local_48) && (bVar3));
    pTVar5 = local_50;
    if (local_48 != 0) {
      sVar10 = 0;
      do {
        local_38 = local_40[sVar10];
        if (local_38 == (uchar *)0x0) {
LAB_001a1f65:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
        }
        if (*local_38 == '\0') {
          uVar4 = 0;
        }
        else {
          uVar4 = CONCAT11(*local_38,local_38[1]);
        }
        p_Var12 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar4;
        uVar13 = (uint)uVar4;
        ppvVar7 = (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                 ((long)(local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar7 >> 3);
        depth = 2;
        pTVar5 = local_50;
        if (p_Var12 < in_RCX) {
          lVar11 = 0;
          do {
            if (((ulong)ppvVar7[(long)p_Var12] & 1) == 0) break;
            if ((char)uVar4 == '\0') {
              __assert_fail("not is_end(c)",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                            ,0xeb,
                            "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                           );
            }
            pTVar5 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                     ::get_node(pTVar5,(uint)p_Var12);
            if (local_38 == (uchar *)0x0) goto LAB_001a1f65;
            if (local_38[lVar11 + 2] == '\0') {
              uVar4 = 0;
            }
            else {
              uVar4 = CONCAT11(local_38[lVar11 + 2],local_38[lVar11 + 3]);
            }
            p_Var12 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar4;
            ppvVar7 = (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
            in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                     ((long)(pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar7 >> 3);
            lVar11 = lVar11 + 2;
          } while (p_Var12 < in_RCX);
          uVar13 = (uint)p_Var12;
          depth = lVar11 + 2;
        }
        this = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_bucket(pTVar5,uVar13);
        if (this == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
          __assert_fail("bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xf1,
                        "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                       );
        }
        __position._M_current = *(uchar ***)(this + 8);
        if (__position._M_current == *(uchar ***)(this + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(this,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          *(long *)(this + 8) = *(long *)(this + 8) + 8;
        }
        if (((char)uVar4 != '\0') && (0x20000 < (ulong)(*(long *)(this + 8) - *(long *)this))) {
          pTVar8 = BurstSimple<unsigned_short>::operator()
                             (&local_51,
                              (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this,
                              depth);
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar4;
          *(TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
            **)((long)(pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_start + (ulong)((uint)uVar4 * 8)) = pTVar8;
          ppvVar7 = (pTVar5->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = *(ulong *)((long)ppvVar7 + (ulong)((uint)uVar4 * 8));
          if (uVar9 == 0) {
LAB_001a1f27:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x5c,"void make_trie(void *&)");
          }
          ppvVar7[(long)in_RCX] = (void *)(uVar9 | 1);
          if (*(void **)this != (void *)0x0) {
            operator_delete(*(void **)this);
          }
          operator_delete(this);
        }
        sVar10 = sVar10 + 1;
        pTVar5 = local_50;
      } while (sVar10 != local_48);
    }
  }
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
            (pTVar5,local_40,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}